

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::BlockingSample>(Serializer *this,BlockingSample *ptr)

{
  if (ptr == (BlockingSample *)0x0) {
    (*this->_vptr_Serializer[10])(this,0);
  }
  else {
    (*this->_vptr_Serializer[10])(this,1);
    (*this->_vptr_Serializer[6])(this);
    (*ptr->_vptr_BlockingSample[7])(ptr,this);
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[0xb])(this);
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}